

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferPtr xmlOutputBufferCreateFile(FILE *file,xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  FILE *file_local;
  
  if (file == (FILE *)0x0) {
    xmlCharEncCloseFunc(encoder);
    file_local = (FILE *)0x0;
  }
  else {
    file_local = (FILE *)xmlAllocOutputBuffer(encoder);
    if (file_local != (FILE *)0x0) {
      *(FILE **)file_local = file;
      file_local->_IO_read_ptr = (char *)xmlFileWrite;
      file_local->_IO_read_end = (char *)xmlFileFlush;
    }
  }
  return (xmlOutputBufferPtr)file_local;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateFile(FILE *file, xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (file == NULL) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = file;
	ret->writecallback = xmlFileWrite;
	ret->closecallback = xmlFileFlush;
    }

    return(ret);
}